

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

bool __thiscall NJamSpell::TSpellCorrector::LoadLangModel(TSpellCorrector *this,string *modelFile)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  undefined1 local_48 [8];
  string cacheFile;
  
  bVar2 = TLangModel::Load(&this->LangModel,modelFile);
  if (bVar2) {
    pcVar1 = (modelFile->_M_dataplus)._M_p;
    local_48 = (undefined1  [8])&cacheFile._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + modelFile->_M_string_length);
    std::__cxx11::string::append((char *)local_48);
    bVar3 = LoadCache(this,(string *)local_48);
    if (!bVar3) {
      PrepareCache(this);
      SaveCache(this,(string *)local_48);
    }
    if (local_48 != (undefined1  [8])&cacheFile._M_string_length) {
      operator_delete((void *)local_48);
    }
  }
  return bVar2;
}

Assistant:

bool TSpellCorrector::LoadLangModel(const std::string& modelFile) {
    if (!LangModel.Load(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!LoadCache(cacheFile)) {
        PrepareCache();
        SaveCache(cacheFile);
    }
    return true;
}